

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O0

SHADER_STATUS __thiscall
Diligent::SerializedShaderImpl::GetStatus(SerializedShaderImpl *this,bool WaitForCompletion)

{
  bool bVar1;
  unique_ptr *this_00;
  pointer pCVar2;
  Char *pCVar3;
  undefined1 local_88 [8];
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  SHADER_STATUS Status;
  value_type *pCompiledShader;
  size_t type;
  SHADER_STATUS OverallStatus;
  bool WaitForCompletion_local;
  SerializedShaderImpl *this_local;
  
  type._0_4_ = SHADER_STATUS_READY;
  for (pCompiledShader = (value_type *)0x0; pCompiledShader < (value_type *)0x7;
      pCompiledShader =
           (value_type *)
           ((long)&(pCompiledShader->_M_t).
                   super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                   .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>.
                   _M_head_impl + 1)) {
    this_00 = (unique_ptr *)
              std::
              array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
              ::operator[](&this->m_Shaders,(size_type)pCompiledShader);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      pCVar2 = std::
               unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
               ::operator->((unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                             *)this_00);
      msg.field_2._12_4_ = (*pCVar2->_vptr_CompiledShader[4])(pCVar2,(ulong)(WaitForCompletion & 1))
      ;
      switch(msg.field_2._12_4_) {
      case 0:
        FormatString<char[40]>
                  ((string *)local_58,(char (*) [40])"Shader status must not be uninitialized");
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"GetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                   ,0xd0);
        std::__cxx11::string::~string((string *)local_58);
        break;
      case 1:
        type._0_4_ = SHADER_STATUS_COMPILING;
        break;
      case 2:
        break;
      case 3:
        return SHADER_STATUS_FAILED;
      default:
        FormatString<char[25]>((string *)local_88,(char (*) [25])"Unexpected shader status");
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"GetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                   ,0xdf);
        std::__cxx11::string::~string((string *)local_88);
      }
    }
  }
  return (SHADER_STATUS)type;
}

Assistant:

SHADER_STATUS SerializedShaderImpl::GetStatus(bool WaitForCompletion)
{
    SHADER_STATUS OverallStatus = SHADER_STATUS_READY;
    for (size_t type = 0; type < static_cast<size_t>(DeviceType::Count); ++type)
    {
        const auto& pCompiledShader = m_Shaders[type];
        if (!pCompiledShader)
            continue;

        const SHADER_STATUS Status = pCompiledShader->GetStatus(WaitForCompletion);
        switch (Status)
        {
            case SHADER_STATUS_UNINITIALIZED:
                UNEXPECTED("Shader status must not be uninitialized");
                break;

            case SHADER_STATUS_COMPILING:
                OverallStatus = SHADER_STATUS_COMPILING;
                break;

            case SHADER_STATUS_READY:
                // Nothing to do
                break;

            case SHADER_STATUS_FAILED:
                return SHADER_STATUS_FAILED;

            default:
                UNEXPECTED("Unexpected shader status");
                break;
        }
    }

    return OverallStatus;
}